

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import-utils.h
# Opt level: O0

Global * __thiscall wasm::ImportInfo::getImportedGlobal(ImportInfo *this,Name module,Name base)

{
  Global *pGVar1;
  bool bVar2;
  reference ppGVar3;
  Global *import;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Global_*,_std::allocator<wasm::Global_*>_> *__range2;
  ImportInfo *this_local;
  Name base_local;
  Name module_local;
  
  base_local.super_IString.str._M_str = module.super_IString.str._M_len;
  base_local.super_IString.str._M_len = base.super_IString.str._M_str;
  this_local = base.super_IString.str._M_len;
  __end2 = std::vector<wasm::Global_*,_std::allocator<wasm::Global_*>_>::begin
                     (&this->importedGlobals);
  import = (Global *)
           std::vector<wasm::Global_*,_std::allocator<wasm::Global_*>_>::end(&this->importedGlobals)
  ;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::Global_**,_std::vector<wasm::Global_*,_std::allocator<wasm::Global_*>_>_>
                                *)&import);
    if (!bVar2) {
      return (Global *)0x0;
    }
    ppGVar3 = __gnu_cxx::
              __normal_iterator<wasm::Global_**,_std::vector<wasm::Global_*,_std::allocator<wasm::Global_*>_>_>
              ::operator*(&__end2);
    pGVar1 = *ppGVar3;
    bVar2 = IString::operator==(&(pGVar1->super_Importable).module.super_IString,
                                (IString *)&base_local.super_IString.str._M_str);
    if ((bVar2) &&
       (bVar2 = IString::operator==(&(pGVar1->super_Importable).base.super_IString,
                                    (IString *)&this_local), bVar2)) break;
    __gnu_cxx::
    __normal_iterator<wasm::Global_**,_std::vector<wasm::Global_*,_std::allocator<wasm::Global_*>_>_>
    ::operator++(&__end2);
  }
  return pGVar1;
}

Assistant:

Global* getImportedGlobal(Name module, Name base) {
    for (auto* import : importedGlobals) {
      if (import->module == module && import->base == base) {
        return import;
      }
    }
    return nullptr;
  }